

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_3d.hpp
# Opt level: O3

cartesian_cubic<float> *
sisl::io::read_raw_file<float>
          (int *rx,int *ry,int *rz,string *file,e_datatype *type,bool *swap_endian)

{
  undefined4 uVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  cartesian_cubic<float> *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar12;
  ushort uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ifstream fp;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in|_S_bin|_S_ate);
  if ((*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) &&
     (cVar7 = std::__basic_file<char>::is_open(), cVar7 != '\0')) {
    uVar10 = std::istream::tellg();
    std::istream::seekg((long)local_238,_S_beg);
    uVar14 = 0xffffffffffffffff;
    if (-1 < (long)uVar10) {
      uVar14 = uVar10;
    }
    pvVar11 = operator_new__(uVar14);
    std::istream::read((char *)local_238,(long)pvVar11);
    this = (cartesian_cubic<float> *)operator_new(0x68);
    cartesian_cubic<float>::cartesian_cubic(this,*rx - 1,*ry - 1,*rz - 1);
    switch(*type) {
    case SDT_UINT8:
      iVar9 = *rx;
      if (0 < iVar9) {
        iVar8 = *ry;
        uVar15 = 0;
        do {
          if (0 < iVar8) {
            iVar9 = *rz;
            uVar14 = 0;
            do {
              if (0 < iVar9) {
                uVar10 = 0;
                do {
                  bVar3 = *(byte *)((long)pvVar11 +
                                   (long)(int)((*ry * (int)uVar10 + (int)uVar14) * *rx + uVar15));
                  iVar9 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar15,uVar14,uVar10);
                  *(float *)CONCAT44(extraout_var,iVar9) = (float)bVar3;
                  uVar16 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar16;
                  iVar9 = *rz;
                } while ((int)uVar16 < iVar9);
                iVar8 = *ry;
              }
              uVar16 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar16;
            } while ((int)uVar16 < iVar8);
            iVar9 = *rx;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < iVar9);
      }
      break;
    case SDT_UINT16:
      iVar9 = *rx;
      if (0 < iVar9) {
        iVar8 = *ry;
        uVar15 = 0;
        do {
          if (0 < iVar8) {
            iVar9 = *rz;
            uVar14 = 0;
            do {
              if (0 < iVar9) {
                uVar10 = 0;
                do {
                  uVar5 = *(ushort *)
                           ((long)pvVar11 +
                           (long)(int)((*ry * (int)uVar10 + (int)uVar14) * *rx + uVar15) * 2);
                  bVar4 = *swap_endian;
                  iVar9 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar15,uVar14,uVar10);
                  uVar13 = uVar5 << 8 | uVar5 >> 8;
                  if (bVar4 == false) {
                    uVar13 = uVar5;
                  }
                  *(float *)CONCAT44(extraout_var_03,iVar9) = (float)uVar13;
                  uVar16 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar16;
                  iVar9 = *rz;
                } while ((int)uVar16 < iVar9);
                iVar8 = *ry;
              }
              uVar16 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar16;
            } while ((int)uVar16 < iVar8);
            iVar9 = *rx;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < iVar9);
      }
      break;
    case SDT_UINT32:
      iVar9 = *rx;
      if (0 < iVar9) {
        iVar8 = *ry;
        uVar15 = 0;
        do {
          if (0 < iVar8) {
            iVar9 = *rz;
            uVar14 = 0;
            do {
              if (0 < iVar9) {
                uVar10 = 0;
                do {
                  uVar16 = *(uint *)((long)pvVar11 +
                                    (long)(int)((*ry * (int)uVar10 + (int)uVar14) * *rx + uVar15) *
                                    4);
                  bVar4 = *swap_endian;
                  iVar9 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar15,uVar14,uVar10);
                  uVar6 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                          uVar16 << 0x18;
                  if (bVar4 == false) {
                    uVar6 = uVar16;
                  }
                  *(float *)CONCAT44(extraout_var_01,iVar9) = (float)uVar6;
                  uVar16 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar16;
                  iVar9 = *rz;
                } while ((int)uVar16 < iVar9);
                iVar8 = *ry;
              }
              uVar16 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar16;
            } while ((int)uVar16 < iVar8);
            iVar9 = *rx;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < iVar9);
      }
      break;
    case SDT_FLOAT:
      iVar9 = *rx;
      if (0 < iVar9) {
        iVar8 = *ry;
        uVar15 = 0;
        do {
          if (0 < iVar8) {
            iVar9 = *rz;
            uVar14 = 0;
            do {
              if (0 < iVar9) {
                uVar10 = 0;
                do {
                  uVar1 = *(undefined4 *)
                           ((long)pvVar11 +
                           (long)(int)((*ry * (int)uVar10 + (int)uVar14) * *rx + uVar15) * 4);
                  iVar9 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar15,uVar14,uVar10);
                  *(undefined4 *)CONCAT44(extraout_var_02,iVar9) = uVar1;
                  uVar16 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar16;
                  iVar9 = *rz;
                } while ((int)uVar16 < iVar9);
                iVar8 = *ry;
              }
              uVar16 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar16;
            } while ((int)uVar16 < iVar8);
            iVar9 = *rx;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < iVar9);
      }
      break;
    case SDT_DOUBLE:
      iVar9 = *rx;
      if (0 < iVar9) {
        iVar8 = *ry;
        uVar15 = 0;
        do {
          if (0 < iVar8) {
            iVar9 = *rz;
            uVar14 = 0;
            do {
              if (0 < iVar9) {
                uVar10 = 0;
                do {
                  dVar2 = *(double *)
                           ((long)pvVar11 +
                           (long)(int)((*ry * (int)uVar10 + (int)uVar14) * *rx + uVar15) * 8);
                  iVar9 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar15,uVar14,uVar10);
                  *(float *)CONCAT44(extraout_var_00,iVar9) = (float)dVar2;
                  uVar16 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar16;
                  iVar9 = *rz;
                } while ((int)uVar16 < iVar9);
                iVar8 = *ry;
              }
              uVar16 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar16;
            } while ((int)uVar16 < iVar8);
            iVar9 = *rx;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < iVar9);
      }
      break;
    default:
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = "Unknown datatype passed to sisl::io::read_raw_file()!";
      __cxa_throw(puVar12,&char_const*::typeinfo,0);
    }
    operator_delete__(pvVar11);
  }
  else {
    this = (cartesian_cubic<float> *)0x0;
  }
  std::ifstream::~ifstream(local_238);
  return this;
}

Assistant:

inline cartesian_cubic<O>
       *read_raw_file(const int &rx, const int &ry, const int &rz,
                      const std::string &file, 
                      const e_datatype &type,
                      const bool &swap_endian = false) {
    using namespace std;

    // Define this to help indexing the raw data
    #define INDEX(i,j,k)  i + rx * ( j + ry*k )

    // Open the file
    ifstream fp(file.c_str(), ios::in | ios::binary | ios::ate);
    streampos size;

    if (!fp.good() || !fp.is_open()) return nullptr;
    size = fp.tellg();
    fp.seekg(0, ios::beg);

    // Allocate and Read
    char *buffer = new char[size];
    fp.read(buffer, size);

    // Allocate the array
    cartesian_cubic<O> *lattice = new cartesian_cubic<O>(rx-1, ry-1, rz-1);

    switch (type) {
        case SDT_UINT8:
        {
            unsigned char *l_buff = (unsigned char *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_UINT16:
        {
            unsigned short *l_buff = (unsigned short *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint16_t data = l_buff[INDEX(i,j,k)];

                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_16(data) : data); 
                    }
            break;
        }
        case SDT_UINT32:
        {
            unsigned int *l_buff = (unsigned int *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint32_t data = l_buff[INDEX(i,j,k)];
                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_32(data) : data); 
                    }
            break;
        }
        case SDT_FLOAT:
        {
            float *l_buff = (float *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_DOUBLE:
        {
            double *l_buff = (double *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        default:
            throw "Unknown datatype passed to sisl::io::read_raw_file()!";
    }
    delete[] buffer;
    #undef INDEX

    return lattice;
}